

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitTryTableStart
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,TryTable *trytable,Name label,
          Type inputType)

{
  Name originalLabel;
  ScopeCtx local_e8;
  ScopeCtx *local_38;
  TryTable *trytable_local;
  IRBuilder *this_local;
  Type inputType_local;
  Name label_local;
  
  inputType_local.id = label.super_IString.str._M_len;
  local_38 = (ScopeCtx *)trytable;
  trytable_local = (TryTable *)this;
  this_local = (IRBuilder *)inputType.id;
  applyDebugLoc(this,(Expression *)trytable);
  originalLabel.super_IString.str._M_str = (char *)this_local;
  originalLabel.super_IString.str._M_len = (size_t)label.super_IString.str._M_str;
  ScopeCtx::makeTryTable(&local_e8,local_38,(TryTable *)inputType_local.id,originalLabel,inputType);
  pushScope(__return_storage_ptr__,this,&local_e8);
  ScopeCtx::~ScopeCtx(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::visitTryTableStart(TryTable* trytable, Name label, Type inputType) {
  applyDebugLoc(trytable);
  return pushScope(ScopeCtx::makeTryTable(trytable, label, inputType));
}